

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O3

int __thiscall DetectorSS::PointQuery(DetectorSS *this,uint32_t key)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int iVar4;
  long lVar5;
  uint32_t hashval [4];
  uint32_t hkey [3];
  uint32_t local_4c;
  uint local_48 [5];
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_4c = key;
  local_34 = key;
  local_30 = key;
  local_2c = key;
  MurmurHash3_x64_128(&local_34,0xc,(uint32_t)*(this->ss_).hash,local_48);
  if ((this->ss_).tdepth < 1) {
    iVar1 = 0;
  }
  else {
    lVar5 = 0;
    iVar1 = 0;
    do {
      iVar2 = (int)((long)(this->ss_).width * (ulong)local_48[lVar5] >> 0x20);
      if (lVar5 == 0) {
        iVar1 = Estimate(this,iVar2,*(this->ss_).counts);
      }
      iVar2 = Estimate(this,iVar2,(this->ss_).counts[lVar5]);
      if (iVar1 < iVar2) {
        iVar2 = iVar1;
      }
      iVar1 = iVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->ss_).tdepth);
  }
  if (4 < (this->ss_).depth) {
    lVar5 = 4;
    do {
      iVar2 = (this->ss_).lgn;
      iVar4 = iVar2 + 7;
      if (-1 < iVar2) {
        iVar4 = iVar2;
      }
      uVar3 = MurmurHash64A(&local_4c,iVar4 >> 3,(this->ss_).hash[lVar5]);
      iVar2 = Estimate(this,(int)((long)(this->ss_).width * (uVar3 & 0xffffffff) >> 0x20),
                       (this->ss_).counts[lVar5]);
      if (iVar1 < iVar2) {
        iVar2 = iVar1;
      }
      iVar1 = iVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->ss_).depth);
  }
  return iVar1;
}

Assistant:

int DetectorSS::PointQuery(uint32_t key) {
	uint32_t hkey[3] = { key, key, key };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)hkey, 12, ss_.hash[0], (unsigned char*)hashval);
	int ret = 0;
	int degree = 0;
	for (int i = 0; i < ss_.tdepth; i++) {
		unsigned bucket = (uint32_t)hashval[i] * (unsigned long)ss_.width >> 32;
		if (i == 0) {
			ret = Estimate(bucket, ss_.counts[i]);
		}
		degree = Estimate(bucket, ss_.counts[i]);
		ret = ret > degree ? degree : ret;
	}
	for (int i = 4; i < ss_.depth; i++) {
		unsigned bucket = MurmurHash64A((unsigned char*)(&key), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		degree = Estimate(bucket, ss_.counts[i]);
		ret = ret > degree ? degree : ret;
	}
	return ret;
}